

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err http_parse_header(nng_http *conn,void *line)

{
  size_t sVar1;
  bool bVar2;
  char *local_38;
  char *end;
  char *val;
  char *key;
  void *line_local;
  nng_http *conn_local;
  
  end = strchr((char *)line,0x3a);
  if (end == (char *)0x0) {
    conn_local._4_4_ = NNG_EPROTO;
  }
  else {
    *end = '\0';
    do {
      end = end + 1;
      bVar2 = true;
      if (*end != ' ') {
        bVar2 = *end == '\t';
      }
    } while (bVar2);
    sVar1 = strlen(end);
    local_38 = end + sVar1;
    while( true ) {
      local_38 = local_38 + -1;
      bVar2 = false;
      if ((end < local_38) && (bVar2 = true, *local_38 != ' ')) {
        bVar2 = *local_38 == '\t';
      }
      if (!bVar2) break;
      *local_38 = '\0';
    }
    conn_local._4_4_ = nni_http_add_header(conn,(char *)line,end);
  }
  return conn_local._4_4_;
}

Assistant:

static nng_err
http_parse_header(nng_http *conn, void *line)
{
	char *key = line;
	char *val;
	char *end;

	// Find separation between key and value
	if ((val = strchr(key, ':')) == NULL) {
		return (NNG_EPROTO);
	}

	// Trim leading and trailing whitespace from header
	*val = '\0';
	val++;
	while (*val == ' ' || *val == '\t') {
		val++;
	}
	end = val + strlen(val);
	end--;
	while ((end > val) && (*end == ' ' || *end == '\t')) {
		*end = '\0';
		end--;
	}

	return (nni_http_add_header(conn, key, val));
}